

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli_bit_stream.cc
# Opt level: O0

void __thiscall
brotli::BlockEncoder::BuildAndStoreEntropyCodes<704>
          (BlockEncoder *this,
          vector<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_> *histograms,
          size_t *storage_ix,uint8_t *storage)

{
  size_t length;
  size_type sVar1;
  const_reference histogram;
  reference depth;
  reference bits;
  size_t ix;
  size_t i;
  uint8_t *storage_local;
  size_t *storage_ix_local;
  vector<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_> *histograms_local;
  BlockEncoder *this_local;
  
  sVar1 = std::vector<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_>::size
                    (histograms);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&this->depths_,sVar1 * this->alphabet_size_);
  sVar1 = std::vector<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_>::size
                    (histograms);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize
            (&this->bits_,sVar1 * this->alphabet_size_);
  ix = 0;
  while( true ) {
    sVar1 = std::vector<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_>::size
                      (histograms);
    if (sVar1 <= ix) break;
    sVar1 = ix * this->alphabet_size_;
    histogram = std::vector<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_>::
                operator[](histograms,ix);
    length = this->alphabet_size_;
    depth = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                      (&this->depths_,sVar1);
    bits = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                     (&this->bits_,sVar1);
    BuildAndStoreHuffmanTree(histogram->data_,length,depth,bits,storage_ix,storage);
    ix = ix + 1;
  }
  return;
}

Assistant:

void BuildAndStoreEntropyCodes(
      const std::vector<Histogram<kSize> >& histograms,
      size_t* storage_ix, uint8_t* storage) {
    depths_.resize(histograms.size() * alphabet_size_);
    bits_.resize(histograms.size() * alphabet_size_);
    for (size_t i = 0; i < histograms.size(); ++i) {
      size_t ix = i * alphabet_size_;
      BuildAndStoreHuffmanTree(&histograms[i].data_[0], alphabet_size_,
                               &depths_[ix], &bits_[ix],
                               storage_ix, storage);
    }
  }